

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O0

void __thiscall
data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::StringBuilder__
          (void *this,StringBuilder *sb)

{
  uint uVar1;
  int iVar2;
  iterator this_00;
  size_type sVar3;
  undefined8 uVar4;
  reference puVar5;
  uint32_t pc;
  uint local_4c;
  iterator iStack_48;
  uint32_t i_1;
  iterator it_1;
  uint32_t lc;
  Annotation *a;
  uint local_24;
  iterator iStack_20;
  uint32_t i;
  iterator it;
  StringBuilder *sb_local;
  AccessIterator *this_local;
  
  uVar1 = *(uint *)((long)this + 0x10);
  it._M_node = (_Base_ptr)sb;
  sVar3 = std::
          set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::size(*this);
  if (uVar1 < sVar3) {
    iStack_20 = std::
                set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                ::begin(*this);
    local_24 = 0;
    while (local_24 < *(uint *)((long)this + 0x10)) {
      local_24 = local_24 + 1;
      std::_Rb_tree_const_iterator<const_snestistics::Annotation_*>::operator++
                (&stack0xffffffffffffffe0,0);
    }
    std::_Rb_tree_const_iterator<const_snestistics::Annotation_*>::operator*
              (&stack0xffffffffffffffe0);
    this_00 = it;
    uVar4 = std::__cxx11::string::c_str();
    snestistics::StringBuilder::format((StringBuilder *)this_00._M_node,"%s",uVar4);
  }
  else {
    iVar2 = *(int *)((long)this + 0x10);
    sVar3 = std::
            set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
            ::size(*this);
    it_1._M_node._4_4_ = iVar2 - (int)sVar3;
    iStack_48 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                begin(*(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> **
                       )((long)this + 8));
    local_4c = 0;
    while (local_4c < it_1._M_node._4_4_) {
      local_4c = local_4c + 1;
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&stack0xffffffffffffffb8,0);
    }
    puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&stack0xffffffffffffffb8);
    snestistics::StringBuilder::format((StringBuilder *)it._M_node,"%06X",(ulong)*puVar5);
  }
  return;
}

Assistant:

void emit(StringBuilder &sb) {
				if (_current < _known.size()) {
					auto it = _known.begin();
					for (uint32_t i=0; i<_current; i++, it++);
					const Annotation *a = *it;
					sb.format("%s", a->name.c_str());
				} else {
					uint32_t lc = _current - (uint32_t)_known.size();
					auto it = _unknown.begin();
					for (uint32_t i=0; i<lc; i++, it++);
					const uint32_t pc = *it;
					sb.format("%06X", pc);
				}
			}